

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_asn1.cc
# Opt level: O1

int BN_parse_asn1_unsigned(CBS *cbs,BIGNUM *ret)

{
  int iVar1;
  BIGNUM *pBVar2;
  int line;
  int is_negative;
  CBS child;
  int local_1c;
  CBS local_18;
  
  iVar1 = CBS_get_asn1(cbs,&local_18,2);
  if ((iVar1 == 0) || (iVar1 = CBS_is_valid_asn1_integer(&local_18,&local_1c), iVar1 == 0)) {
    iVar1 = 0x75;
    line = 0x1a;
  }
  else {
    if (local_1c == 0) {
      pBVar2 = BN_bin2bn(local_18.data,(int)local_18.len,(BIGNUM *)ret);
      return (uint)(pBVar2 != (BIGNUM *)0x0);
    }
    iVar1 = 0x6d;
    line = 0x1f;
  }
  ERR_put_error(3,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/bn_asn1.cc"
                ,line);
  return 0;
}

Assistant:

int BN_parse_asn1_unsigned(CBS *cbs, BIGNUM *ret) {
  CBS child;
  int is_negative;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_INTEGER) ||
      !CBS_is_valid_asn1_integer(&child, &is_negative)) {
    OPENSSL_PUT_ERROR(BN, BN_R_BAD_ENCODING);
    return 0;
  }

  if (is_negative) {
    OPENSSL_PUT_ERROR(BN, BN_R_NEGATIVE_NUMBER);
    return 0;
  }

  return BN_bin2bn(CBS_data(&child), CBS_len(&child), ret) != NULL;
}